

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  Coroutine<void> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  DelayedCloseWebSocket *this_02;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  PromiseAwaiter<void> *pPVar2;
  
  handle._M_fr_ptr = operator_new(0x5c8);
  *(code **)handle._M_fr_ptr = pumpTo;
  *(code **)((long)handle._M_fr_ptr + 8) = pumpTo;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(WebSocket **)((long)handle._M_fr_ptr + 0x5b8) = other;
  location.function = "pumpTo";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1b40;
  location.columnNumber = 0x17;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5a8);
  (**(code **)(*other[2]._vptr_WebSocket + 0x38))(this_01);
  pPVar2 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
  co_await<void>(pPVar2,(Promise<void> *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5c0) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
  if (!bVar1) {
    kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
    this_02 = (DelayedCloseWebSocket *)((long)handle._M_fr_ptr + 0x5b0);
    afterReceiveClosed(this_02);
    pPVar2 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x3f0);
    co_await<void>(pPVar2,(Promise<void> *)this_02);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5c0) = 1;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
    if (!bVar1) {
      kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
      *(undefined8 *)handle._M_fr_ptr = 0;
      *(undefined1 *)((long)handle._M_fr_ptr + 0x5c0) = 2;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
      co_await inner->pumpTo(other);
      co_await afterReceiveClosed();
    }